

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

D_ParseNode * d_find_in_tree(D_ParseNode *apn,int symbol)

{
  uint uVar1;
  ulong uVar2;
  D_ParseNode *pDVar3;
  
  pDVar3 = apn + -2;
  if (apn == (D_ParseNode *)0x0) {
    pDVar3 = (D_ParseNode *)0x0;
  }
  if (pDVar3[2].symbol != symbol) {
    uVar1 = *(uint *)&pDVar3->end_skip;
    uVar2 = 0;
    do {
      if (uVar1 == uVar2) {
        return (D_ParseNode *)0x0;
      }
      apn = d_find_in_tree((D_ParseNode *)(*(long *)(&pDVar3->scope->field_0x0 + uVar2 * 8) + 0x90),
                           symbol);
      uVar2 = uVar2 + 1;
    } while (apn == (D_ParseNode *)0x0);
  }
  return apn;
}

Assistant:

D_ParseNode *d_find_in_tree(D_ParseNode *apn, int symbol) {
  PNode *pn = D_ParseNode_to_PNode(apn);
  D_ParseNode *res;
  uint i;

  if (pn->parse_node.symbol == symbol) return apn;
  for (i = 0; i < pn->children.n; i++)
    if ((res = d_find_in_tree(&pn->children.v[i]->parse_node, symbol))) return res;
  return NULL;
}